

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_38;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pDst;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pSrc_end;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)pDst_void;
  for (pSrc_end = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)pSrc_void;
      pSrc_end != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)((long)pSrc_void + (ulong)num * 0xc)
      ; pSrc_end = pSrc_end + 1) {
    std::pair<crnlib::vec<2U,_float>,_unsigned_int>::pair(local_38,pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }